

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O1

void __thiscall
sglr::rc::TextureCubeArray::sample4
          (TextureCubeArray *this,Vec4 *output,Vec4 *packetTexcoords,float lodBias)

{
  Vec4 *pVVar1;
  float fVar2;
  int i;
  CubeFace face;
  long lVar3;
  float *pfVar4;
  int fragNdx;
  ulong uVar5;
  uint uVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  Vec2 faceCoords [4];
  Vec2 dFdy1;
  Vec2 dFdy0;
  Vec2 dFdx1;
  Vec2 dFdx0;
  Vec3 cubeCoords [4];
  tcu local_b8 [8];
  tcu local_b0 [8];
  tcu local_a8 [8];
  tcu local_a0 [8];
  float local_98 [8];
  Vec3 local_78;
  Vec3 local_6c;
  Vec3 local_60;
  Vec3 local_54;
  TextureCubeArrayView local_40;
  
  if ((this->m_view).m_numLevels < 1) {
    fVar7 = 0.0;
  }
  else {
    fVar7 = (float)(((this->m_view).m_levels)->m_size).m_data[0];
  }
  local_78.m_data[2] = packetTexcoords->m_data[2];
  local_78.m_data._0_8_ = *(undefined8 *)packetTexcoords->m_data;
  local_6c.m_data[2] = packetTexcoords[1].m_data[2];
  local_6c.m_data._0_8_ = *(undefined8 *)packetTexcoords[1].m_data;
  local_60.m_data._0_8_ = *(undefined8 *)packetTexcoords[2].m_data;
  local_60.m_data[2] = packetTexcoords[2].m_data[2];
  local_54.m_data._0_8_ = *(undefined8 *)packetTexcoords[3].m_data;
  local_54.m_data[2] = packetTexcoords[3].m_data[2];
  uVar5 = 0;
  do {
    face = tcu::selectCubeFace(&local_78 + uVar5);
    tcu::projectToFace(local_b8,face,&local_78);
    tcu::projectToFace(local_b0,face,&local_6c);
    tcu::projectToFace(local_a8,face,&local_60);
    tcu::projectToFace(local_a0,face,&local_54);
    local_98[6] = 0.0;
    local_98[7] = 0.0;
    lVar3 = 0;
    do {
      local_98[lVar3 + 6] = *(float *)(local_b0 + lVar3 * 4) - *(float *)(local_b8 + lVar3 * 4);
      lVar3 = lVar3 + 1;
    } while (lVar3 == 1);
    local_98[4] = 0.0;
    local_98[5] = 0.0;
    lVar3 = 0;
    do {
      local_98[lVar3 + 4] = *(float *)(local_a0 + lVar3 * 4) - *(float *)(local_a8 + lVar3 * 4);
      lVar3 = lVar3 + 1;
    } while (lVar3 == 1);
    local_98[2] = 0.0;
    local_98[3] = 0.0;
    lVar3 = 0;
    do {
      local_98[lVar3 + 2] = *(float *)(local_a8 + lVar3 * 4) - *(float *)(local_b8 + lVar3 * 4);
      lVar3 = lVar3 + 1;
    } while (lVar3 == 1);
    local_98[0] = 0.0;
    local_98[1] = 0.0;
    lVar3 = 0;
    do {
      local_98[lVar3] = *(float *)(local_a0 + lVar3 * 4) - *(float *)(local_b0 + lVar3 * 4);
      lVar3 = lVar3 + 1;
    } while (lVar3 == 1);
    pfVar4 = local_98 + 4;
    if (uVar5 < 2) {
      pfVar4 = local_98 + 6;
    }
    fVar10 = *pfVar4;
    fVar9 = pfVar4[1];
    fVar8 = -fVar10;
    if (-fVar10 <= fVar10) {
      fVar8 = fVar10;
    }
    pfVar4 = local_98;
    if ((uVar5 & 1) == 0) {
      pfVar4 = local_98 + 2;
    }
    fVar10 = *pfVar4;
    fVar2 = pfVar4[1];
    fVar11 = -fVar10;
    if (-fVar10 <= fVar10) {
      fVar11 = fVar10;
    }
    fVar10 = -fVar9;
    if (-fVar9 <= fVar9) {
      fVar10 = fVar9;
    }
    fVar9 = -fVar2;
    if (-fVar2 <= fVar2) {
      fVar9 = fVar2;
    }
    fVar8 = (float)(~-(uint)(fVar11 <= fVar8) & (uint)fVar11 |
                   (uint)fVar8 & -(uint)(fVar11 <= fVar8)) * fVar7;
    fVar10 = (float)(~-(uint)(fVar9 <= fVar10) & (uint)fVar9 |
                    (uint)fVar10 & -(uint)(fVar9 <= fVar10)) * fVar7;
    uVar6 = -(uint)(fVar10 <= fVar8);
    fVar10 = logf((float)(~uVar6 & (uint)fVar10 | (uint)fVar8 & uVar6));
    tcu::TextureCubeArrayView::sample
              (&local_40,(Sampler *)&this->m_view,packetTexcoords[uVar5].m_data[0],
               packetTexcoords[uVar5].m_data[1],packetTexcoords[uVar5].m_data[2],
               packetTexcoords[uVar5].m_data[3],fVar10 * 1.442695 + lodBias);
    pVVar1 = output + uVar5;
    pVVar1->m_data[0] = (float)local_40.m_numLevels;
    pVVar1->m_data[1] = (float)local_40._4_4_;
    *(ConstPixelBufferAccess **)(pVVar1->m_data + 2) = local_40.m_levels;
    uVar5 = uVar5 + 1;
  } while (uVar5 != 4);
  return;
}

Assistant:

void TextureCubeArray::sample4 (tcu::Vec4 output[4], const tcu::Vec4 packetTexcoords[4], float lodBias) const
{
	const float		cubeSide		= (float)m_view.getSize();
	const tcu::Vec3	cubeCoords[4]	=
	{
		packetTexcoords[0].toWidth<3>(),
		packetTexcoords[1].toWidth<3>(),
		packetTexcoords[2].toWidth<3>(),
		packetTexcoords[3].toWidth<3>()
	};

	for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
	{
		const tcu::CubeFace face			= tcu::selectCubeFace(cubeCoords[fragNdx]);
		const tcu::Vec2		faceCoords[4]	=
		{
			tcu::projectToFace(face, cubeCoords[0]),
			tcu::projectToFace(face, cubeCoords[1]),
			tcu::projectToFace(face, cubeCoords[2]),
			tcu::projectToFace(face, cubeCoords[3]),
		};

		const tcu::Vec2 dFdx0 = faceCoords[1] - faceCoords[0];
		const tcu::Vec2 dFdx1 = faceCoords[3] - faceCoords[2];
		const tcu::Vec2 dFdy0 = faceCoords[2] - faceCoords[0];
		const tcu::Vec2 dFdy1 = faceCoords[3] - faceCoords[1];

		const tcu::Vec2& dFdx = (fragNdx & 2) ? dFdx1 : dFdx0;
		const tcu::Vec2& dFdy = (fragNdx & 1) ? dFdy1 : dFdy0;

		const float mu = de::max(de::abs(dFdx.x()), de::abs(dFdy.x()));
		const float mv = de::max(de::abs(dFdx.y()), de::abs(dFdy.y()));
		const float p = de::max(mu * cubeSide, mv * cubeSide);

		const float	lod = deFloatLog2(p) + lodBias;

		output[fragNdx] = sample(packetTexcoords[fragNdx].x(), packetTexcoords[fragNdx].y(), packetTexcoords[fragNdx].z(), packetTexcoords[fragNdx].w(), lod);
	}
}